

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O3

vm_obj_id_t __thiscall CVmMetaclass::get_supermeta(CVmMetaclass *this,int idx)

{
  vm_meta_entry_t *pvVar1;
  CVmMetaTable *pCVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar4;
  vm_obj_id_t vVar5;
  
  vVar5 = 0;
  if (idx == 0) {
    iVar3 = (*this->_vptr_CVmMetaclass[0xb])();
    pCVar2 = G_meta_table_X;
    vVar5 = 0;
    if (CONCAT44(extraout_var,iVar3) != 0) {
      iVar3 = (*this->_vptr_CVmMetaclass[0xb])(this);
      pvVar1 = pCVar2->table_;
      lVar4 = (long)pCVar2->reverse_map_[*(uint *)(CONCAT44(extraout_var_00,iVar3) + 8)];
      if (pvVar1 != (vm_meta_entry_t *)0x0 && -1 < lVar4) {
        vVar5 = pvVar1[lVar4].class_obj_;
      }
    }
  }
  return vVar5;
}

Assistant:

vm_obj_id_t CVmMetaclass::get_supermeta(VMG_ int idx) const
{
    vm_meta_entry_t *entry;

    /* we only have one supermetaclass */
    if (idx != 0)
        return VM_INVALID_OBJ;

    /* if I don't have a supermetaclass at all, return nil */
    if (get_supermeta_reg() == 0)
        return VM_INVALID_OBJ;

    /* look up my supermetaclass entry */
    entry = (G_meta_table->get_entry_from_reg(
        get_supermeta_reg()->get_reg_idx()));

    /* return the IntrinsicClass object that represents this metaclass */
    return (entry != 0 ? entry->class_obj_ : VM_INVALID_OBJ);
}